

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O1

void getPointsBoudingBox(GLfloat (*points) [2],GLsizei n_points,GLfloat (*bounds) [2])

{
  float fVar1;
  float fVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (n_points != 0) {
    fVar6 = (*points)[0];
    fVar7 = (*points)[1];
    fVar4 = fVar6;
    fVar5 = fVar7;
    if (1 < n_points) {
      lVar3 = 0;
      fVar1 = fVar6;
      fVar2 = fVar7;
      do {
        fVar7 = points[lVar3 + 1][0];
        fVar6 = fVar7;
        if (fVar1 <= fVar7) {
          fVar6 = fVar1;
        }
        if (fVar7 <= fVar4) {
          fVar7 = fVar4;
        }
        fVar4 = fVar7;
        fVar1 = points[lVar3 + 1][1];
        fVar7 = fVar1;
        if (fVar2 <= fVar1) {
          fVar7 = fVar2;
        }
        if (fVar1 <= fVar5) {
          fVar1 = fVar5;
        }
        fVar5 = fVar1;
        lVar3 = lVar3 + 1;
        fVar1 = fVar6;
        fVar2 = fVar7;
      } while ((ulong)(uint)n_points - 1 != lVar3);
    }
    (*bounds)[0] = fVar6;
    (*bounds)[1] = fVar7;
    bounds[1][0] = fVar4;
    bounds[1][1] = fVar5;
  }
  return;
}

Assistant:

void getPointsBoudingBox(GLfloat points[][2], GLsizei n_points, GLfloat bounds[][2]) {
	if (n_points == 0) return;

	double x_min, x_max, y_min, y_max;
	x_min = x_max = points[0][0];
	y_min = y_max = points[0][1];

	for (GLsizei i = 1; i < n_points; i++) {
		x_min = MIN(points[i][0], x_min);
		x_max = MAX(points[i][0], x_max);
		y_min = MIN(points[i][1], y_min);
		y_max = MAX(points[i][1], y_max);
	}

	bounds[0][0] = x_min;
	bounds[0][1] = y_min;
	bounds[1][0] = x_max;
	bounds[1][1] = y_max;
}